

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchC::emulate_mthd(MthdKelvinFdBeginPatchC *this)

{
  pgraph_state *state;
  uint uVar1;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type != 0x20) {
    nv04_pgraph_missing_hw(state);
    return;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 8) != 0) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_fd_check_skip & 4) == 0
     )) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    if ((uVar1 & 0x10) != 0) {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((char)uVar1 < '\0') {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((uVar1 >> 0x18 & 1) != 0) {
      nv04_pgraph_blowup(state,0x80000);
    }
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc = uVar1 | 0x1000000;
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
       uVar1 & 0xfeffff7f | 0x80;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_shadow_begin_patch_c =
       uVar1 & 0x7fffffff;
  pgraph_fd_cmd(state,0x2810,uVar1);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type != 0x20) {
			nv04_pgraph_missing_hw(&exp);
			return;
		}
		if (extr(exp.debug_d, 3, 1) && !extr(exp.debug_fd_check_skip, 2, 1)) {
			if (extr(exp.fe3d_misc, 4, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 7, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 24, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
		}
		if (!exp.nsource) {
			insrt(exp.fe3d_misc, 24, 1, 0);
			insrt(exp.fe3d_misc, 7, 1, 1);
			exp.fe3d_shadow_begin_patch_c = val & 0x7fffffff;
			pgraph_fd_cmd(&exp, 0x2810, val);
		} else {
			insrt(exp.fe3d_misc, 24, 1, 1);
		}
	}